

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QAnimationTimer::updateAnimationsTime(QAnimationTimer *this,qint64 delta)

{
  int iVar1;
  long lVar2;
  parameter_type pVar3;
  Direction DVar4;
  qsizetype qVar5;
  QScopedValueRollback<bool> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int elapsed;
  QAbstractAnimation *animation;
  QScopedValueRollback<bool> guard;
  bool *in_stack_ffffffffffffff88;
  QScopedValueRollback<bool> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffc8;
  bool *pbVar6;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(byte *)(in_RDI + 0x24) & 1) == 0) &&
     (*(long *)(in_RDI + 0x18) = (long)&in_RSI->varRef + *(long *)(in_RDI + 0x18),
     in_RSI != (QScopedValueRollback<bool> *)0x0)) {
    pbVar6 = (bool *)&DAT_aaaaaaaaaaaaaaaa;
    QScopedValueRollback<bool>::QScopedValueRollback
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
    *(undefined4 *)(in_RDI + 0x20) = 0;
    while (iVar1 = *(int *)(in_RDI + 0x20),
          qVar5 = QList<QAbstractAnimation_*>::size((QList<QAbstractAnimation_*> *)(in_RDI + 0x28)),
          iVar1 < qVar5) {
      QList<QAbstractAnimation_*>::at
                ((QList<QAbstractAnimation_*> *)in_stack_ffffffffffffff90,
                 (qsizetype)in_stack_ffffffffffffff88);
      QAbstractAnimationPrivate::get((QAbstractAnimation *)0x669a6e);
      pVar3 = ::QObjectCompatProperty::operator_cast_to_int
                        ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                          *)0x669a83);
      DVar4 = QAbstractAnimation::direction((QAbstractAnimation *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff90 = in_RSI;
      if (DVar4 != Forward) {
        in_stack_ffffffffffffff90 = (QScopedValueRollback<bool> *)-(long)in_RSI;
      }
      QAbstractAnimation::setCurrentTime
                ((QAbstractAnimation *)
                 CONCAT44(pVar3 + (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffffc8),
                 (int)((ulong)pbVar6 >> 0x20));
      *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
    }
    *(undefined4 *)(in_RDI + 0x20) = 0;
    QScopedValueRollback<bool>::~QScopedValueRollback
              ((QScopedValueRollback<bool> *)&stack0xffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAnimationTimer::updateAnimationsTime(qint64 delta)
{
    //setCurrentTime can get this called again while we're the for loop. At least with pauseAnimations
    if (insideTick)
        return;

    lastTick += delta;

    //we make sure we only call update time if the time has actually changed
    //it might happen in some cases that the time doesn't change because events are delayed
    //when the CPU load is high
    if (delta) {
        QScopedValueRollback<bool> guard(insideTick, true);
        for (currentAnimationIdx = 0; currentAnimationIdx < animations.size(); ++currentAnimationIdx) {
            QAbstractAnimation *animation = animations.at(currentAnimationIdx);
            int elapsed = QAbstractAnimationPrivate::get(animation)->totalCurrentTime
                          + (animation->direction() == QAbstractAnimation::Forward ? delta : -delta);
            animation->setCurrentTime(elapsed);
        }
        currentAnimationIdx = 0;
    }
}